

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O3

void RDL_fillURFs(RDL_URFinfo *uInfo,RDL_cfURF *CFs)

{
  uint uVar1;
  long lVar2;
  void *__ptr;
  void *pvVar3;
  RDL_cfam ***URFs;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_6c;
  
  uVar1 = uInfo->nofWeights;
  uVar8 = (ulong)uVar1;
  __ptr = malloc(uVar8 * 8);
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else {
    puVar4 = uInfo->nofProtos;
    uVar10 = 0;
    do {
      pvVar3 = malloc((ulong)puVar4[uVar10]);
      *(void **)((long)__ptr + uVar10 * 8) = pvVar3;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    if (uVar1 == 0) {
      uVar8 = 0;
    }
    else {
      puVar4 = uInfo->nofProtos;
      uVar10 = 0;
      do {
        if (puVar4[uVar10] != 0) {
          lVar2 = *(long *)((long)__ptr + uVar10 * 8);
          uVar8 = 0;
          do {
            *(undefined1 *)(lVar2 + uVar8) = 0;
            uVar8 = uVar8 + 1;
            puVar4 = uInfo->nofProtos;
          } while (uVar8 < puVar4[uVar10]);
          uVar8 = (ulong)uInfo->nofWeights;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar8);
    }
  }
  uVar10 = (ulong)uInfo->nofURFs;
  URFs = (RDL_cfam ***)malloc(uVar10 * 8);
  puVar4 = (uint *)malloc(uVar10 * 4);
  if (uVar10 != 0) {
    memset(puVar4,0,uVar10 * 4);
  }
  if ((int)uVar8 != 0) {
    puVar5 = uInfo->nofProtos;
    uVar10 = 0;
    local_6c = 0;
    do {
      uVar9 = (ulong)puVar5[uVar10];
      if (puVar5[uVar10] != 0) {
        uVar8 = 0;
        do {
          if ((uInfo->URFrel[uVar10][uVar8][uVar8] == '\x01') &&
             (lVar2 = *(long *)((long)__ptr + uVar10 * 8), *(char *)(lVar2 + uVar8) == '\0')) {
            if (uVar8 < uVar9) {
              uVar9 = uVar8;
              do {
                if (uInfo->URFrel[uVar10][uVar8][uVar9] == '\x01') {
                  if (uVar10 == 0) {
                    iVar6 = 0;
                  }
                  else {
                    uVar7 = 0;
                    iVar6 = 0;
                    do {
                      iVar6 = iVar6 + puVar5[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar10 != uVar7);
                  }
                  uVar1 = puVar4[local_6c];
                  RDL_addRCFtoURF((int)uVar9 + iVar6,local_6c,uVar1,URFs,CFs);
                  puVar4[local_6c] = uVar1 + 1;
                  *(undefined1 *)(lVar2 + uVar9) = 1;
                  puVar5 = uInfo->nofProtos;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < puVar5[uVar10]);
            }
            local_6c = local_6c + 1;
          }
          uVar8 = uVar8 + 1;
          uVar9 = (ulong)puVar5[uVar10];
        } while (uVar8 < uVar9);
        uVar8 = (ulong)uInfo->nofWeights;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar8);
    if ((int)uVar8 != 0) {
      uVar8 = 0;
      do {
        free(*(void **)((long)__ptr + uVar8 * 8));
        uVar8 = uVar8 + 1;
      } while (uVar8 < uInfo->nofWeights);
    }
  }
  free(__ptr);
  uInfo->URFs = URFs;
  uInfo->nofCFsPerURF = puVar4;
  return;
}

Assistant:

void RDL_fillURFs(RDL_URFinfo *uInfo, RDL_cfURF *CFs)
{
  RDL_cfam ***URFs;
  unsigned *nofRCFs;
  unsigned currURFIdx=0;
  unsigned i,j,k;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  URFs = malloc(uInfo->nofURFs * sizeof(*URFs));
  nofRCFs = malloc(uInfo->nofURFs * sizeof(*nofRCFs));
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    nofRCFs[i] = 0;
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      /*if this family is not already part of a URF*/
      if((uInfo->URFrel[i][j][j] == 1) && (alreadyInURF[i][j] == 0))
      {
        for(k=j; k<uInfo->nofProtos[i]; ++k)
        {
          if(uInfo->URFrel[i][j][k] == 1)
          {
            /*add to current URF the CFs with the given Idx*/
            RDL_addRCFtoURF(RDL_idxWeight(uInfo,i,k),currURFIdx,
                            nofRCFs[currURFIdx],URFs,CFs);
            ++nofRCFs[currURFIdx];
            alreadyInURF[i][k] = 1;
          }
        }
        ++currURFIdx;
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  uInfo->URFs=URFs;
  uInfo->nofCFsPerURF = nofRCFs;
}